

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

bool_t ecpIsValid(ec_o *ec,void *stack)

{
  word *a;
  word *b;
  word *stack_00;
  size_t sVar1;
  qr_o *pqVar2;
  bool_t bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  sVar1 = ec->f->n;
  bVar3 = ecIsOperable2(ec);
  uVar5 = 0;
  uVar6 = 0;
  if (bVar3 != 0) {
    a = (word *)((long)stack + sVar1 * 8);
    b = a + sVar1;
    stack_00 = b + sVar1;
    bVar3 = gfpIsValid(ec->f,stack_00);
    if (bVar3 != 0) {
      iVar4 = wwCmpW(ec->f->mod,ec->f->n,3);
      if ((0 < iVar4) && (pqVar2 = ec->f, uVar5 = uVar6, pqVar2->deep <= ec->deep)) {
        iVar4 = wwCmp(ec->A,pqVar2->mod,pqVar2->n);
        if (iVar4 < 0) {
          iVar4 = wwCmp(ec->B,ec->f->mod,ec->f->n);
          if (iVar4 < 0) {
            (*ec->f->sqr)((word *)stack,ec->A,ec->f,stack_00);
            (*ec->f->mul)((word *)stack,(word *)stack,ec->A,ec->f,stack_00);
            zzDoubleMod((word *)stack,(word *)stack,ec->f->mod,ec->f->n);
            zzDoubleMod((word *)stack,(word *)stack,ec->f->mod,ec->f->n);
            (*ec->f->sqr)(a,ec->B,ec->f,stack_00);
            zzDoubleMod(b,a,ec->f->mod,ec->f->n);
            zzAddMod(a,a,b,ec->f->mod,ec->f->n);
            zzDoubleMod(b,a,ec->f->mod,ec->f->n);
            zzAddMod(a,a,b,ec->f->mod,ec->f->n);
            zzDoubleMod(b,a,ec->f->mod,ec->f->n);
            zzAddMod(a,a,b,ec->f->mod,ec->f->n);
            zzAddMod((word *)stack,(word *)stack,a,ec->f->mod,ec->f->n);
            bVar3 = wwIsZero((word *)stack,ec->f->n);
            uVar5 = (uint)(bVar3 == 0);
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

bool_t ecpIsValid(const ec_o* ec, void* stack)
{
	size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	word* t3 = t2 + n;
	stack = t3 + n;
	// кривая работоспособна?
	// поле ec->f корректно?
	// f->mod > 3?
	// ec->deep >= ec->f->deep?
	// A, B \in ec->f?
	if (!ecIsOperable2(ec) ||
		!gfpIsValid(ec->f, stack) ||
		wwCmpW(ec->f->mod, ec->f->n, 3) <= 0 ||
		ec->deep < ec->f->deep ||
		!zmIsIn(ec->A, ec->f) || 
		!zmIsIn(ec->B, ec->f))
		return FALSE;
	// t1 <- 4 A^3
	qrSqr(t1, ec->A, ec->f, stack);
	qrMul(t1, t1, ec->A, ec->f, stack);
	gfpDouble(t1, t1, ec->f);
	gfpDouble(t1, t1, ec->f);
	// t2 <- 27 B^2
	qrSqr(t2, ec->B, ec->f, stack);
	gfpDouble(t3, t2, ec->f);
	zmAdd(t2, t2, t3, ec->f);
	gfpDouble(t3, t2, ec->f);
	zmAdd(t2, t2, t3, ec->f);
	gfpDouble(t3, t2, ec->f);
	zmAdd(t2, t2, t3, ec->f);
	// t1 <- t1 + t2 [4 A^3 + 27 B^2 -- дискриминант]
	zmAdd(t1, t1, t2, ec->f);
	// t1 == 0 => сингулярная кривая
	return !qrIsZero(t1, ec->f);
}